

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imreadwrite.cpp
# Opt level: O3

Mat * cv::imread(Mat *__return_storage_ptr__,string *path,int flags)

{
  uchar uVar1;
  int *piVar2;
  int _cols;
  uchar *p;
  stbi_uc *__ptr;
  uchar *puVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  int c;
  int h;
  int w;
  int local_54;
  int local_50;
  int local_4c;
  Mat local_48;
  
  if (flags == -1) {
    __ptr = stbi_load((path->_M_dataplus)._M_p,&local_4c,&local_50,&local_54,0);
    iVar6 = local_50;
    _cols = local_4c;
  }
  else {
    if (flags == 0) {
      iVar6 = 1;
    }
    else {
      if (flags != 1) goto LAB_001397f8;
      iVar6 = 3;
    }
    __ptr = stbi_load((path->_M_dataplus)._M_p,&local_4c,&local_50,&local_54,iVar6);
    local_54 = iVar6;
    iVar6 = local_50;
    _cols = local_4c;
  }
  if (__ptr == (stbi_uc *)0x0) {
LAB_001397f8:
    *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
    __return_storage_ptr__->cols = 0;
    __return_storage_ptr__->c = 0;
    __return_storage_ptr__->data = (uchar *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
    return __return_storage_ptr__;
  }
  local_48.rows = 0;
  local_48.cols = 0;
  local_48.c = 0;
  local_48.data = (uchar *)0x0;
  local_48.refcount._0_4_ = 0;
  local_48.refcount._4_4_ = 0;
  if (local_54 == 4) {
    Mat::create(&local_48,iVar6,_cols,4);
  }
  else if (local_54 == 3) {
    Mat::create(&local_48,iVar6,_cols,3);
  }
  else {
    if (local_54 != 1) {
      free(__ptr);
      *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
      __return_storage_ptr__->cols = 0;
      __return_storage_ptr__->c = 0;
      __return_storage_ptr__->data = (uchar *)0x0;
      __return_storage_ptr__->refcount = (int *)0x0;
      goto LAB_00139907;
    }
    Mat::create(&local_48,iVar6,_cols,1);
  }
  memcpy(local_48.data,__ptr,(long)local_54 * (long)iVar6 * (long)_cols);
  free(__ptr);
  if (local_54 == 3) {
    iVar4 = iVar6 * _cols;
    puVar3 = local_48.data;
    if (0 < iVar4) {
      do {
        uVar1 = *puVar3;
        *puVar3 = puVar3[2];
        puVar3[2] = uVar1;
        puVar3 = puVar3 + 3;
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      goto LAB_001398a0;
    }
  }
  else {
LAB_001398a0:
    if ((local_54 == 4) && (0 < iVar6 * _cols)) {
      lVar5 = 0;
      do {
        uVar1 = local_48.data[lVar5 * 4];
        local_48.data[lVar5 * 4] = local_48.data[lVar5 * 4 + 2];
        local_48.data[lVar5 * 4 + 2] = uVar1;
        lVar5 = lVar5 + 1;
      } while (iVar6 * _cols != (int)lVar5);
    }
  }
  __return_storage_ptr__->data = local_48.data;
  piVar2 = (int *)CONCAT44(local_48.refcount._4_4_,local_48.refcount._0_4_);
  __return_storage_ptr__->refcount = piVar2;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + 1;
    UNLOCK();
  }
  __return_storage_ptr__->rows = local_48.rows;
  __return_storage_ptr__->cols = local_48.cols;
  __return_storage_ptr__->c = local_48.c;
LAB_00139907:
  piVar2 = (int *)CONCAT44(local_48.refcount._4_4_,local_48.refcount._0_4_);
  if (piVar2 == (int *)0x0) {
    return __return_storage_ptr__;
  }
  LOCK();
  *piVar2 = *piVar2 + -1;
  UNLOCK();
  if (*piVar2 != 0) {
    return __return_storage_ptr__;
  }
  if (local_48.data == (uchar *)0x0) {
    return __return_storage_ptr__;
  }
  free(local_48.data);
  return __return_storage_ptr__;
}

Assistant:

Mat imread(const std::string& path, int flags)
{
    int desired_channels = 0;
    if (flags == IMREAD_UNCHANGED)
    {
        desired_channels = 0;
    }
    else if (flags == IMREAD_GRAYSCALE)
    {
        desired_channels = 1;
    }
    else if (flags == IMREAD_COLOR)
    {
        desired_channels = 3;
    }
    else
    {
        // unknown flags
        return Mat();
    }

    int w;
    int h;
    int c;
    unsigned char* pixeldata = stbi_load(path.c_str(), &w, &h, &c, desired_channels);
    if (!pixeldata)
    {
        // load failed
        return Mat();
    }

    if (desired_channels)
    {
        c = desired_channels;
    }

    // copy pixeldata to Mat
    Mat img;
    if (c == 1)
    {
        img.create(h, w, CV_8UC1);
    }
    else if (c == 3)
    {
        img.create(h, w, CV_8UC3);
    }
    else if (c == 4)
    {
        img.create(h, w, CV_8UC4);
    }
    else
    {
        // unexpected channels
        stbi_image_free(pixeldata);
        return Mat();
    }

    memcpy(img.data, pixeldata, static_cast<size_t>(w) * static_cast<size_t>(h) * static_cast<size_t>(c));

    stbi_image_free(pixeldata);

    //     // resolve exif orientation
    //     {
    //         std::ifstream ifs;
    //         ifs.open(filename.c_str(), std::ifstream::in);
    //
    //         if (ifs.good())
    //         {
    //             ExifReader exif_reader(ifs);
    //             if (exif_reader.parse())
    //             {
    //                 ExifEntry_t e = exif_reader.getTag(ORIENTATION);
    //                 int orientation = e.field_u16;
    //                 if (orientation >= 1 && orientation <= 8)
    //                     rotate_by_orientation(img, img, orientation);
    //             }
    //         }
    //
    //         ifs.close();
    //     }

    // rgb to bgr
    if (c == 3)
    {
        uchar* p = img.data;
        for (int i = 0; i < w * h; i++)
        {
            std::swap(p[0], p[2]);
            p += 3;
        }
    }
    if (c == 4)
    {
        uchar* p = img.data;
        for (int i = 0; i < w * h; i++)
        {
            std::swap(p[0], p[2]);
            p += 4;
        }
    }

    return img;
}